

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O0

int i2d_PKCS12(PKCS12 *a,uchar **out)

{
  uchar *puVar1;
  uint8_t **out_local;
  PKCS12 *p12_local;
  
  if (a->mac < (PKCS12_MAC_DATA *)0x80000000) {
    if (out == (uchar **)0x0) {
      p12_local._4_4_ = (int)a->mac;
    }
    else {
      if (*out == (uchar *)0x0) {
        puVar1 = (uchar *)OPENSSL_memdup(a->version,(size_t)a->mac);
        *out = puVar1;
        if (*out == (uchar *)0x0) {
          return -1;
        }
      }
      else {
        OPENSSL_memcpy(*out,a->version,(size_t)a->mac);
        *out = *out + (long)&a->mac->dinfo;
      }
      p12_local._4_4_ = (int)a->mac;
    }
  }
  else {
    ERR_put_error(0x13,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                  ,0x313);
    p12_local._4_4_ = -1;
  }
  return p12_local._4_4_;
}

Assistant:

int i2d_PKCS12(const PKCS12 *p12, uint8_t **out) {
  if (p12->ber_len > INT_MAX) {
    OPENSSL_PUT_ERROR(PKCS8, ERR_R_OVERFLOW);
    return -1;
  }

  if (out == NULL) {
    return (int)p12->ber_len;
  }

  if (*out == NULL) {
    *out = reinterpret_cast<uint8_t *>(
        OPENSSL_memdup(p12->ber_bytes, p12->ber_len));
    if (*out == NULL) {
      return -1;
    }
  } else {
    OPENSSL_memcpy(*out, p12->ber_bytes, p12->ber_len);
    *out += p12->ber_len;
  }
  return (int)p12->ber_len;
}